

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

bool tinyusdz::ConvertTokenAttributeToStringAttribute
               (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *inp,
               TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *out)

{
  pointer pSVar1;
  bool bVar2;
  vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
  *pvVar3;
  Sample *item;
  pointer pSVar4;
  Animatable<tinyusdz::Token> toks;
  TypedTimeSamples<tinyusdz::Token> tok_ts;
  Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> strs;
  Animatable<tinyusdz::Token> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  AttrMetas::operator=(&out->_metas,&inp->_metas);
  if (inp->_blocked == true) {
    out->_blocked = true;
  }
  else {
    bVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::is_value_empty(inp);
    if (bVar2) {
      out->_value_empty = true;
    }
    else if (((inp->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              (inp->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
              _M_impl.super__Vector_impl_data._M_start) || (((inp->_attrib).has_value_ & 1U) != 0))
    {
      local_d0._value.str_._M_dataplus._M_p = (pointer)&local_d0._value.str_.field_2;
      local_d0._value.str_._M_string_length = 0;
      local_d0._value.str_.field_2._M_local_buf[0] = '\0';
      local_68._value._M_dataplus._M_p = (pointer)&local_68._value.field_2;
      local_68._value._M_string_length = 0;
      local_68._value.field_2._M_local_buf[0] = '\0';
      local_d0._has_value = false;
      local_d0._blocked = false;
      local_68._has_value = false;
      local_68._blocked = false;
      local_d0._ts._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d0._ts._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_d0._ts._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_d0._ts._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_d0._ts._17_8_ = 0;
      local_68._ts._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68._ts._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_68._ts._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_68._ts._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_68._ts._17_8_ = 0;
      bVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::get_value(inp,&local_d0);
      if (bVar2) {
        if (local_d0._ts._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (pointer)CONCAT71(local_d0._ts._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                              local_d0._ts._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_finish._0_1_) &&
            local_d0._blocked == false) {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          local_88._M_string_length = 0;
          local_88.field_2._M_local_buf[0] = '\0';
          Animatable<tinyusdz::Token>::get_scalar(&local_d0,(Token *)&local_88);
          Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::set(&local_68,&local_88);
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          if (local_d0._blocked != false) {
            Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Animatable(&local_68);
            Animatable<tinyusdz::Token>::~Animatable(&local_d0);
            return false;
          }
          if (local_d0._ts._samples.
              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)CONCAT71(local_d0._ts._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                local_d0._ts._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_finish._0_1_) &&
              local_d0._has_value == false) {
            TypedTimeSamples<tinyusdz::Token>::TypedTimeSamples
                      ((TypedTimeSamples<tinyusdz::Token> *)&local_88,&local_d0._ts);
            pvVar3 = TypedTimeSamples<tinyusdz::Token>::get_samples
                               ((TypedTimeSamples<tinyusdz::Token> *)&local_88);
            pSVar1 = (pvVar3->
                     super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (pSVar4 = (pvVar3->
                          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                          )._M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar1;
                pSVar4 = pSVar4 + 1) {
              TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::add_sample(&local_68._ts,pSVar4->t,&(pSVar4->value).str_);
            }
            ::std::
            vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
            ::~vector((vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>_>
                       *)&local_88);
          }
        }
      }
      nonstd::optional_lite::optional<tinyusdz::Animatable<std::__cxx11::string>>::operator=
                ((optional<tinyusdz::Animatable<std::__cxx11::string>> *)&out->_attrib,&local_68);
      Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Animatable(&local_68);
      Animatable<tinyusdz::Token>::~Animatable(&local_d0);
    }
    else {
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&out->_paths,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&inp->_paths);
    }
  }
  return true;
}

Assistant:

bool ConvertTokenAttributeToStringAttribute(
    const TypedAttribute<Animatable<value::token>> &inp,
    TypedAttribute<Animatable<std::string>> &out) {
  
    out.metas() = inp.metas();
  
    if (inp.is_blocked()) {
      out.set_blocked(true);
    } else if (inp.is_value_empty()) {
      out.set_value_empty();
    } else if (inp.is_connection()) {
      out.set_connections(inp.get_connections());
    } else {
      Animatable<value::token> toks;
      Animatable<std::string> strs;
      if (inp.get_value(&toks)) {
        if (toks.is_scalar()) {
          value::token tok;
          toks.get_scalar(&tok);
          strs.set(tok.str());
        } else if (toks.is_timesamples()) {
          auto tok_ts = toks.get_timesamples();
  
          for (auto &item : tok_ts.get_samples()) {
            strs.add_sample(item.t, item.value.str());
          }
        } else if (toks.is_blocked()) {
          // TODO
          return false;
        }
      }
      out.set_value(strs);
    }
  
    return true;
  }